

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParticleCloud.cpp
# Opt level: O3

void __thiscall
chrono::ChParticleCloud::IntStateGather
          (ChParticleCloud *this,uint off_x,ChState *x,uint off_v,ChStateDelta *v,double *T)

{
  long lVar1;
  ChAparticle *this_00;
  double *pdVar2;
  int iVar3;
  pointer ppCVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  Index index_2;
  ulong uVar9;
  Index index;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  double local_48 [3];
  
  ppCVar4 = (this->particles).
            super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->particles).
      super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppCVar4) {
    uVar10 = 0;
    uVar12 = off_x + 3;
    uVar8 = off_v + 3;
    uVar11 = (ulong)off_v;
    uVar6 = (ulong)off_x;
    do {
      iVar3 = (int)uVar10;
      lVar1 = (x->super_ChVectorDynamic<double>).
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      uVar5 = iVar3 * 7 + off_x;
      if (lVar1 + -3 < (long)(ulong)uVar5) goto LAB_00530e10;
      this_00 = ppCVar4[uVar10];
      pdVar2 = (x->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      uVar10 = 3;
      if (((ulong)(pdVar2 + uVar5) & 7) == 0) {
        uVar7 = -((uint)((ulong)(pdVar2 + uVar5) >> 3) & 0x1fffffff) & 7;
        if ((ulong)uVar7 < 3) {
          uVar10 = (ulong)uVar7;
        }
        if (uVar7 != 0) goto LAB_00530bd3;
      }
      else {
LAB_00530bd3:
        uVar9 = 0;
        do {
          pdVar2[uVar6 + uVar9] =
               (this_00->super_ChParticleBase).super_ChFrameMoving<double>.super_ChFrame<double>.
               coord.pos.m_data[uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar10 != uVar9);
      }
      if (uVar10 < 3) {
        do {
          pdVar2[uVar6 + uVar10] =
               (this_00->super_ChParticleBase).super_ChFrameMoving<double>.super_ChFrame<double>.
               coord.pos.m_data[uVar10];
          uVar10 = uVar10 + 1;
        } while (uVar10 != 3);
      }
      if (lVar1 + -4 < (long)(ulong)(uVar5 + 3)) goto LAB_00530e10;
      uVar10 = 4;
      if (((ulong)(pdVar2 + (uVar5 + 3)) & 7) == 0) {
        uVar5 = -((uint)((ulong)(pdVar2 + (uVar5 + 3)) >> 3) & 0x1fffffff) & 7;
        if ((ulong)uVar5 < 4) {
          uVar10 = (ulong)uVar5;
        }
        if (uVar5 != 0) goto LAB_00530c48;
      }
      else {
LAB_00530c48:
        uVar9 = 0;
        do {
          pdVar2[uVar12 + uVar9] =
               (this_00->super_ChParticleBase).super_ChFrameMoving<double>.super_ChFrame<double>.
               coord.rot.m_data[uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar10 != uVar9);
      }
      if (uVar10 < 4) {
        do {
          pdVar2[uVar12 + uVar10] =
               (this_00->super_ChParticleBase).super_ChFrameMoving<double>.super_ChFrame<double>.
               coord.rot.m_data[uVar10];
          uVar10 = uVar10 + 1;
        } while (uVar10 != 4);
      }
      uVar5 = off_v + iVar3 * 6;
      if ((v->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -3 <
          (long)(ulong)uVar5) goto LAB_00530e10;
      pdVar2 = (v->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      uVar10 = 3;
      if (((ulong)(pdVar2 + uVar5) & 7) == 0) {
        uVar7 = -((uint)((ulong)(pdVar2 + uVar5) >> 3) & 0x1fffffff) & 7;
        if ((ulong)uVar7 < 3) {
          uVar10 = (ulong)uVar7;
        }
        if (uVar7 != 0) goto LAB_00530cce;
      }
      else {
LAB_00530cce:
        uVar9 = 0;
        do {
          pdVar2[uVar11 + uVar9] =
               (this_00->super_ChParticleBase).super_ChFrameMoving<double>.coord_dt.pos.m_data
               [uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar10 != uVar9);
      }
      if (uVar10 < 3) {
        do {
          pdVar2[uVar11 + uVar10] =
               (this_00->super_ChParticleBase).super_ChFrameMoving<double>.coord_dt.pos.m_data
               [uVar10];
          uVar10 = uVar10 + 1;
        } while (uVar10 != 3);
      }
      ChFrameMoving<double>::GetWvel_loc((ChFrameMoving<double> *)this_00);
      if ((v->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -3 <
          (long)(ulong)(uVar5 + 3)) {
LAB_00530e10:
        __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                      "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                     );
      }
      pdVar2 = (v->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      uVar10 = 3;
      if (((ulong)(pdVar2 + (uVar5 + 3)) & 7) == 0) {
        uVar5 = -((uint)((ulong)(pdVar2 + (uVar5 + 3)) >> 3) & 0x1fffffff) & 7;
        if ((ulong)uVar5 < 3) {
          uVar10 = (ulong)uVar5;
        }
        if (uVar5 != 0) goto LAB_00530d89;
      }
      else {
LAB_00530d89:
        uVar9 = 0;
        do {
          pdVar2[uVar8 + uVar9] = local_48[uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar10 != uVar9);
      }
      if (uVar10 < 3) {
        do {
          pdVar2[uVar8 + uVar10] = local_48[uVar10];
          uVar10 = uVar10 + 1;
        } while (uVar10 != 3);
      }
      uVar10 = (ulong)(iVar3 + 1);
      uVar6 = (ulong)((int)uVar6 + 7);
      uVar12 = uVar12 + 7;
      uVar11 = (ulong)((int)uVar11 + 6);
      uVar8 = uVar8 + 6;
      *T = (this->super_ChIndexedParticles).super_ChPhysicsItem.super_ChObj.ChTime;
      ppCVar4 = (this->particles).
                super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar10 < (ulong)((long)(this->particles).
                                    super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar4 >> 3)
            );
  }
  return;
}

Assistant:

void ChParticleCloud::IntStateGather(const unsigned int off_x,  // offset in x state vector
                                       ChState& x,                // state vector, position part
                                       const unsigned int off_v,  // offset in v state vector
                                       ChStateDelta& v,           // state vector, speed part
                                       double& T                  // time
) {
    for (unsigned int j = 0; j < particles.size(); j++) {
        x.segment(off_x + 7 * j + 0, 3) = particles[j]->coord.pos.eigen();
        x.segment(off_x + 7 * j + 3, 4) = particles[j]->coord.rot.eigen();

        v.segment(off_v + 6 * j + 0, 3) = particles[j]->coord_dt.pos.eigen();
        v.segment(off_v + 6 * j + 3, 3) = particles[j]->GetWvel_loc().eigen();

        T = GetChTime();
    }
}